

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<float>_>::Subst_Diag(TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *B)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  float *pfVar5;
  ulong uVar6;
  float *pfVar7;
  long lVar8;
  int sz;
  Fad<float> pivot;
  Fad<float> local_a8;
  TPZMatrix<Fad<float>_> *local_88;
  TPZFMatrix<Fad<float>_> *local_80;
  long local_78;
  Fad<float> local_70;
  Fad<float> local_50;
  
  lVar4 = (B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar4 != CONCAT44(extraout_var,iVar3)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar3) != 0 && -1 < extraout_var_00) {
    lVar4 = 0;
    local_88 = this;
    local_80 = B;
    do {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_50,this,lVar4,lVar4);
      if (0 < (B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol) {
        lVar8 = 0;
        local_78 = lVar4;
        do {
          (*(B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_70,B,lVar4);
          iVar2 = local_50.dx_.num_elts;
          iVar3 = local_70.dx_.num_elts;
          local_a8.val_ = local_70.val_ / local_50.val_;
          uVar1 = local_50.dx_.num_elts;
          if (local_50.dx_.num_elts < local_70.dx_.num_elts) {
            uVar1 = local_70.dx_.num_elts;
          }
          local_a8.dx_.num_elts = 0;
          local_a8.dx_.ptr_to_data = (float *)0x0;
          if (0 < (int)uVar1) {
            uVar6 = (ulong)uVar1;
            local_a8.dx_.num_elts = uVar1;
            local_a8.dx_.ptr_to_data = (float *)operator_new__(uVar6 * 4);
            if (0 < (int)uVar1) {
              lVar4 = 0;
              do {
                pfVar5 = (float *)((long)local_70.dx_.ptr_to_data + lVar4);
                if (iVar3 == 0) {
                  pfVar5 = &local_70.defaultVal;
                }
                pfVar7 = (float *)((long)local_50.dx_.ptr_to_data + lVar4);
                if (iVar2 == 0) {
                  pfVar7 = &local_50.defaultVal;
                }
                *(float *)((long)local_a8.dx_.ptr_to_data + lVar4) =
                     (*pfVar5 * local_50.val_ - local_70.val_ * *pfVar7) /
                     (local_50.val_ * local_50.val_);
                lVar4 = lVar4 + 4;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
          }
          lVar4 = local_78;
          B = local_80;
          local_a8.defaultVal = 0.0;
          (*(local_80->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(local_80,local_78,lVar8,&local_a8);
          Fad<float>::~Fad(&local_a8);
          Fad<float>::~Fad(&local_70);
          lVar8 = lVar8 + 1;
        } while (lVar8 < (B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol);
      }
      Fad<float>::~Fad(&local_50);
      this = local_88;
      lVar4 = lVar4 + 1;
      iVar3 = (*(local_88->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(local_88);
    } while (lVar4 < CONCAT44(extraout_var_01,iVar3));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}